

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFFormFieldObjectHelper::generateTextAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  char *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined **ppuVar3;
  undefined1 *puVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  uint uVar7;
  int iVar8;
  string *psVar9;
  QPDFObjectHandle *oh;
  element_type *peVar10;
  undefined8 uVar11;
  long lVar12;
  QPDFFormFieldObjectHelper *resources;
  ulong uVar13;
  code *pcVar14;
  double dVar15;
  QPDFObjectHandle dr;
  string font_name;
  string DA;
  Pl_QPDFTokenizer tok;
  string V;
  TfFinder tff;
  QPDFObjectHandle bbox_obj;
  Rectangle bbox;
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [48];
  string local_178;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  double local_118;
  int local_110;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  pointer local_e8;
  pointer pbStack_e0;
  pointer local_d8;
  shared_ptr<QPDFObjectHandle::TokenFilter> local_c8;
  undefined1 local_b8 [32];
  QPDFObjectHandle local_98;
  QPDFFormFieldObjectHelper *local_88;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  Rectangle local_50;
  
  ppuVar3 = (undefined **)(local_158 + 0x10);
  local_158._0_8_ = ppuVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/N","");
  local_1b8._0_8_ = (element_type *)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  QPDFAnnotationObjectHelper::getAppearanceStream
            ((QPDFAnnotationObjectHelper *)&local_218,(string *)aoh,(string *)local_158);
  if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  if ((undefined **)local_158._0_8_ != ppuVar3) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  bVar6 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_218);
  if (bVar6) {
    QPDFAnnotationObjectHelper::getRect((Rectangle *)local_158,aoh);
    local_1a8._0_8_ = (double)local_158._16_8_ - (double)local_158._0_8_;
    local_1a8._8_8_ = (double)CONCAT44(local_158._28_4_,local_158._24_4_) - (double)local_158._8_8_;
    local_1b8._0_8_ = (element_type *)0x0;
    local_1b8._8_8_ = (element_type *)0x0;
    pcVar1 = local_268 + 0x10;
    local_268._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,
               "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>","");
    local_288._0_8_ = local_288 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
    QPDFObjectHandle::parse((QPDFObjectHandle *)&local_50,(string *)local_268,(string *)local_288);
    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    if ((char *)local_268._0_8_ != pcVar1) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    local_268._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/BBox","");
    QPDFObjectHandle::newFromRectangle((QPDFObjectHandle *)local_288,(Rectangle *)local_1b8);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)&local_50,(string *)local_268,(QPDFObjectHandle *)local_288);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
    }
    if ((char *)local_268._0_8_ != pcVar1) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    local_1d8._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1d8._8_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count + 1;
      }
    }
    psVar9 = (string *)QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)local_1d8);
    local_268._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/Tx BMC\nEMC\n","");
    QPDFObjectHandle::newStream((QPDF *)local_288,psVar9);
    uVar5 = local_218._8_8_;
    local_218._8_8_ = local_288._8_8_;
    local_218._M_allocated_capacity = local_288._0_8_;
    local_288._0_8_ = (char *)0x0;
    local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
    }
    if ((char *)local_268._0_8_ != pcVar1) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
    QPDFObjectHandle::replaceDict((QPDFObjectHandle *)&local_218,(QPDFObjectHandle *)&local_50);
    QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_288);
    bVar6 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_288);
    if (bVar6) {
      local_1d8._0_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1d8._8_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_)->_M_use_count + 1;
        }
      }
      local_268._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/AP","");
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_1d8,(string *)local_268,(QPDFObjectHandle *)&local_178);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length);
      }
      if ((char *)local_268._0_8_ != pcVar1) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
      }
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_268);
      uVar11 = local_268._8_8_;
      local_288._0_8_ = local_268._0_8_;
      uVar5 = local_288._8_8_;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = (element_type *)0x0;
      local_288._8_8_ = uVar11;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5),
         (element_type *)local_268._8_8_ != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
      }
    }
    local_268._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"/N","");
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_288,(string *)local_268,(QPDFObjectHandle *)&local_218);
    if ((char *)local_268._0_8_ != pcVar1) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
    }
    if ((Pipeline *)local_50.lly != (Pipeline *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.lly);
    }
  }
  bVar6 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&local_218);
  if (bVar6) {
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_1b8);
    local_158._0_8_ = ppuVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/BBox","");
    QPDFObjectHandle::getKey(&local_98,(string *)local_1b8);
    if ((undefined **)local_158._0_8_ != ppuVar3) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((element_type *)local_1b8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
    bVar6 = QPDFObjectHandle::isRectangle(&local_98);
    if (bVar6) {
      QPDFObjectHandle::getArrayAsRectangle(&local_50,&local_98);
      getDefaultAppearance_abi_cxx11_((string *)local_1d8,this);
      getValueAsString_abi_cxx11_(&local_178,this);
      local_208._16_8_ = (element_type *)0x0;
      local_208._24_8_ = (element_type *)0x0;
      local_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar6 = isChoice(this);
      if ((bVar6) && (uVar7 = getFlags(this), (uVar7 >> 0x11 & 1) == 0)) {
        getChoices_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8,this);
        local_158._16_8_ = local_1e8._M_pi;
        local_158._8_8_ = local_208._24_8_;
        local_158._0_8_ = local_208._16_8_;
        local_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_;
        local_208._16_8_ = local_1b8._0_8_;
        local_208._24_8_ = local_1b8._8_8_;
        local_1b8._0_8_ = (element_type *)0x0;
        local_1b8._8_8_ = (element_type *)0x0;
        local_1a8._0_8_ = 0.0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
      }
      local_138._M_p = (pointer)&local_128;
      local_158._0_8_ = &PTR__TfFinder_002f0708;
      local_158._16_8_ = 11.0;
      local_158._24_4_ = -1;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_118 = 0.0;
      local_110 = -1;
      local_108._M_p = (pointer)&local_f8;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_e8 = (pointer)0x0;
      pbStack_e0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      uVar11 = 0;
      Pl_QPDFTokenizer::Pl_QPDFTokenizer
                ((Pl_QPDFTokenizer *)local_1b8,"tf",(TokenFilter *)local_158,(Pipeline *)0x0);
      local_88 = this;
      Pipeline::writeString((Pipeline *)local_1b8,(string *)local_1d8);
      Pl_QPDFTokenizer::finish((Pl_QPDFTokenizer *)local_1b8);
      uVar5 = local_158._16_8_;
      local_248._0_8_ = local_248 + 0x10;
      local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_248[0x10] = '\0';
      if ((long)pbStack_e0 - (long)local_e8 != 0) {
        lVar12 = (long)pbStack_e0 - (long)local_e8 >> 5;
        uVar13 = 0;
        do {
          if ((ulong)((long)pbStack_e0 - (long)local_e8 >> 5) <= uVar13) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar13);
          }
          local_268._0_8_ = local_268 + 0x10;
          std::__cxx11::string::_M_construct<char*>((string *)local_268);
          if (uVar13 >> 0x1f != 0) {
            QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar13);
          }
          if (((int)uVar13 == local_158._24_4_) &&
             (dVar15 = strtod((char *)local_268._0_8_,(char **)0x0),
             0.001 < ABS(dVar15 - (double)local_158._16_8_))) {
            QUtil::double_to_string_abi_cxx11_
                      ((string *)local_288,(QUtil *)0x0,(double)local_158._16_8_,1,SUB81(uVar11,0));
            std::__cxx11::string::operator=((string *)local_268,(string *)local_288);
            if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
              operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            }
          }
          std::__cxx11::string::_M_append(local_248,local_268._0_8_);
          if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          uVar13 = uVar13 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != uVar13);
      }
      std::__cxx11::string::operator=((string *)local_1d8,(string *)local_248);
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 0x10);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._0_8_ != p_Var2) {
        operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
      }
      local_268._0_8_ = local_268 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,local_138._M_p,local_138._M_p + local_130);
      if ((element_type *)local_268._8_8_ == (element_type *)0x0) {
        pcVar14 = QUtil::utf8_to_ascii;
      }
      else {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_248);
        pcVar1 = local_288 + 0x10;
        local_288._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"/Resources","");
        resources = local_88;
        psVar9 = (string *)local_248;
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_248 + 0x20),psVar9);
        if ((char *)local_288._0_8_ != pcVar1) {
          psVar9 = (string *)(local_288._16_8_ + 1);
          operator_delete((void *)local_288._0_8_,(ulong)psVar9);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
        }
        local_b8._16_8_ = local_248._32_8_;
        local_b8._24_8_ = p_Stack_220;
        if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_220->_M_use_count = p_Stack_220->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_220->_M_use_count = p_Stack_220->_M_use_count + 1;
          }
        }
        getFontFromResource((QPDFFormFieldObjectHelper *)local_208,(QPDFObjectHandle *)psVar9,
                            (string *)(local_b8 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_);
        }
        if ((element_type *)local_208._0_8_ == (element_type *)0x0) {
          getDefaultResources((QPDFFormFieldObjectHelper *)local_288);
          local_b8._0_8_ = local_288._0_8_;
          local_b8._8_8_ = local_288._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_288._8_8_ + 8) = *(_Atomic_word *)(local_288._8_8_ + 8) + 1;
            }
          }
          getFontFromResource((QPDFFormFieldObjectHelper *)local_248,(QPDFObjectHandle *)resources,
                              (string *)local_b8);
          uVar11 = local_208._8_8_;
          local_208._0_8_ = local_248._0_8_;
          local_208._8_8_ = local_248._8_8_;
          if ((element_type *)uVar11 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
          bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_208);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
          }
          if ((bVar6) &&
             (bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_248 + 0x20)), bVar6)
             ) {
            bVar6 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_248 + 0x20));
            if (bVar6) {
              local_288._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
              oh = (QPDFObjectHandle *)
                   QPDFObjectHandle::getQPDF
                             ((QPDFObjectHandle *)(local_248 + 0x20),(string *)local_288);
              QPDFObjectHandle::shallowCopy(&local_60);
              QPDF::makeIndirectObject((QPDF *)local_248,oh);
              this_00 = p_Stack_220;
              p_Stack_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_;
              local_248._32_8_ = local_248._0_8_;
              local_248._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
              }
              if (local_60.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_60.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((char *)local_288._0_8_ != pcVar1) {
                operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
              }
              QPDFObjectHandle::getDict((QPDFObjectHandle *)local_248);
              local_288._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"/Resources","");
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)local_248,(string *)local_288,
                         (QPDFObjectHandle *)(local_248 + 0x20));
              if ((char *)local_288._0_8_ != pcVar1) {
                operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
              }
            }
            operator____qpdf((char *)&local_70,0x26672d);
            QPDFObjectHandle::mergeResources
                      ((QPDFObjectHandle *)(local_248 + 0x20),&local_70,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        *)0x0);
            if (local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_70.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            local_288._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"/Font","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_248,(string *)(local_248 + 0x20));
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_248,(string *)local_268,
                       (QPDFObjectHandle *)local_208);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
            }
            if ((char *)local_288._0_8_ != pcVar1) {
              operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            }
          }
        }
        bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_208);
        pcVar14 = QUtil::utf8_to_ascii;
        if (bVar6) {
          local_288._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"/Encoding","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_248,(string *)local_208);
          bVar6 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_248);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
          }
          if ((char *)local_288._0_8_ != pcVar1) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          if (bVar6) {
            local_248._0_8_ = p_Var2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"/Encoding","");
            QPDFObjectHandle::getKey(&local_80,(string *)local_208);
            QPDFObjectHandle::getName_abi_cxx11_((string *)local_288,&local_80);
            if (local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._0_8_ != p_Var2) {
              operator_delete((void *)local_248._0_8_,CONCAT71(local_248._17_7_,local_248[0x10]) + 1
                             );
            }
            iVar8 = std::__cxx11::string::compare(local_288);
            if (iVar8 == 0) {
              pcVar14 = QUtil::utf8_to_win_ansi;
            }
            else {
              iVar8 = std::__cxx11::string::compare(local_288);
              if (iVar8 == 0) {
                pcVar14 = QUtil::utf8_to_mac_roman;
              }
              else {
                pcVar14 = QUtil::utf8_to_ascii;
              }
            }
            if ((char *)local_288._0_8_ != pcVar1) {
              operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            }
          }
        }
        if ((element_type *)local_208._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
        }
        if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_220);
        }
      }
      (*pcVar14)(local_288,&local_178,0x3f);
      std::__cxx11::string::operator=((string *)&local_178,(string *)local_288);
      if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
      }
      if (local_208._24_8_ != local_208._16_8_) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          (*pcVar14)((string *)local_288,(undefined1 *)(local_208._16_8_ + lVar12),0x3f);
          if ((ulong)((long)(local_208._24_8_ - local_208._16_8_) >> 5) <= uVar13) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar13);
          }
          std::__cxx11::string::operator=((string *)(local_208._16_8_ + lVar12),(string *)local_288)
          ;
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar13 < (ulong)((long)(local_208._24_8_ - local_208._16_8_) >> 5));
      }
      peVar10 = (element_type *)operator_new(0x98);
      peVar10->_vptr_TokenFilter = (_func_int **)&PTR__ValueSetter_002f0750;
      peVar10[1]._vptr_TokenFilter = (_func_int **)(peVar10 + 2);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(peVar10 + 1),local_1d8._0_8_,
                 (pointer)(local_1d8._0_8_ + (long)(_func_int ***)local_1d8._8_8_));
      peVar10[3]._vptr_TokenFilter = (_func_int **)(peVar10 + 4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(peVar10 + 3),local_178._M_dataplus._M_p,
                 (long)(_func_int ***)local_178._M_string_length + local_178._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(peVar10 + 5),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_208 + 0x10));
      peVar10[6].pipeline = (Pipeline *)uVar5;
      peVar10[7]._vptr_TokenFilter = (_func_int **)local_50.llx;
      peVar10[7].pipeline = (Pipeline *)local_50.lly;
      peVar10[8]._vptr_TokenFilter = (_func_int **)local_50.urx;
      peVar10[8].pipeline = (Pipeline *)local_50.ury;
      *(undefined4 *)&peVar10[9]._vptr_TokenFilter = 0;
      *(undefined1 *)((long)&peVar10[9]._vptr_TokenFilter + 4) = 0;
      local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar10;
      local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002f0798;
      local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)peVar10;
      QPDFObjectHandle::addTokenFilter((QPDFObjectHandle *)&local_218,&local_c8);
      if (local_c8.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.
                   super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      Pl_QPDFTokenizer::~Pl_QPDFTokenizer((Pl_QPDFTokenizer *)local_1b8);
      anon_unknown.dwarf_2d97ef::TfFinder::~TfFinder((TfFinder *)local_158);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_208 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_1d8._0_8_ != (element_type *)local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._0_8_ + 1);
      }
    }
    else {
      local_1b8._0_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1b8._8_8_ =
           (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)local_1b8._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar4 = (undefined1 *)
                   ((long)&(((element_type *)local_1b8._8_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *(int *)puVar4 = *(int *)puVar4 + 1;
          UNLOCK();
        }
        else {
          puVar4 = (undefined1 *)
                   ((long)&(((element_type *)local_1b8._8_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *(int *)puVar4 = *(int *)puVar4 + 1;
        }
      }
      local_158._0_8_ = ppuVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"unable to get appearance stream bounding box","");
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_1b8,(string *)local_158);
      if ((undefined **)local_158._0_8_ != ppuVar3) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((element_type *)local_1b8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
    }
  }
  else {
    local_1b8._0_8_ =
         (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1b8._8_8_ =
         (aoh->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((element_type *)local_1b8._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        puVar4 = (undefined1 *)
                 ((long)&(((element_type *)local_1b8._8_8_)->value).
                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 + 8);
        *(int *)puVar4 = *(int *)puVar4 + 1;
        UNLOCK();
      }
      else {
        puVar4 = (undefined1 *)
                 ((long)&(((element_type *)local_1b8._8_8_)->value).
                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 + 8);
        *(int *)puVar4 = *(int *)puVar4 + 1;
      }
    }
    local_158._0_8_ = ppuVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"unable to get normal appearance stream for update","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_1b8,(string *)local_158);
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
    if ((undefined **)local_158._0_8_ != ppuVar3) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
    }
  }
  if ((element_type *)
      local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateTextAppearance(QPDFAnnotationObjectHelper& aoh)
{
    QPDFObjectHandle AS = aoh.getAppearanceStream("/N");
    if (AS.isNull()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AS from scratch");
        QPDFObjectHandle::Rectangle rect = aoh.getRect();
        QPDFObjectHandle::Rectangle bbox(0, 0, rect.urx - rect.llx, rect.ury - rect.lly);
        QPDFObjectHandle dict = QPDFObjectHandle::parse(
            "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>");
        dict.replaceKey("/BBox", QPDFObjectHandle::newFromRectangle(bbox));
        AS = QPDFObjectHandle::newStream(oh().getOwningQPDF(), "/Tx BMC\nEMC\n");
        AS.replaceDict(dict);
        QPDFObjectHandle AP = aoh.getAppearanceDictionary();
        if (AP.isNull()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AP from scratch");
            aoh.getObjectHandle().replaceKey("/AP", QPDFObjectHandle::newDictionary());
            AP = aoh.getAppearanceDictionary();
        }
        AP.replaceKey("/N", AS);
    }
    if (!AS.isStream()) {
        aoh.getObjectHandle().warnIfPossible("unable to get normal appearance stream for update");
        return;
    }
    QPDFObjectHandle bbox_obj = AS.getDict().getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        aoh.getObjectHandle().warnIfPossible("unable to get appearance stream bounding box");
        return;
    }
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    std::string DA = getDefaultAppearance();
    std::string V = getValueAsString();
    std::vector<std::string> opt;
    if (isChoice() && ((getFlags() & ff_ch_combo) == 0)) {
        opt = getChoices();
    }

    TfFinder tff;
    Pl_QPDFTokenizer tok("tf", &tff);
    tok.writeString(DA);
    tok.finish();
    double tf = tff.getTf();
    DA = tff.getDA();

    std::string (*encoder)(std::string const&, char) = &QUtil::utf8_to_ascii;
    std::string font_name = tff.getFontName();
    if (!font_name.empty()) {
        // See if the font is encoded with something we know about.
        QPDFObjectHandle resources = AS.getDict().getKey("/Resources");
        QPDFObjectHandle font = getFontFromResource(resources, font_name);
        bool found_font_in_dr = false;
        if (!font) {
            QPDFObjectHandle dr = getDefaultResources();
            font = getFontFromResource(dr, font_name);
            found_font_in_dr = font.isDictionary();
        }
        if (found_font_in_dr && resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper get font from /DR");
            if (resources.isIndirect()) {
                resources = resources.getQPDF().makeIndirectObject(resources.shallowCopy());
                AS.getDict().replaceKey("/Resources", resources);
            }
            // Use mergeResources to force /Font to be local
            resources.mergeResources("<< /Font << >> >>"_qpdf);
            resources.getKey("/Font").replaceKey(font_name, font);
        }

        if (font.isDictionary() && font.getKey("/Encoding").isName()) {
            std::string encoding = font.getKey("/Encoding").getName();
            if (encoding == "/WinAnsiEncoding") {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper WinAnsi");
                encoder = &QUtil::utf8_to_win_ansi;
            } else if (encoding == "/MacRomanEncoding") {
                encoder = &QUtil::utf8_to_mac_roman;
            }
        }
    }

    V = (*encoder)(V, '?');
    for (size_t i = 0; i < opt.size(); ++i) {
        opt.at(i) = (*encoder)(opt.at(i), '?');
    }

    AS.addTokenFilter(
        std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ValueSetter(DA, V, opt, tf, bbox)));
}